

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SmallVector<spirv_cross::Instruction,_8UL> * __thiscall
spirv_cross::SmallVector<spirv_cross::Instruction,_8UL>::operator=
          (SmallVector<spirv_cross::Instruction,_8UL> *this,
          SmallVector<spirv_cross::Instruction,_8UL> *other)

{
  uint16_t uVar1;
  uint32_t uVar2;
  Instruction *pIVar3;
  Instruction *pIVar4;
  ulong local_28;
  size_t i;
  SmallVector<spirv_cross::Instruction,_8UL> *other_local;
  SmallVector<spirv_cross::Instruction,_8UL> *this_local;
  
  if (this != other) {
    clear(this);
    reserve(this,(other->super_VectorView<spirv_cross::Instruction>).buffer_size);
    for (local_28 = 0; local_28 < (other->super_VectorView<spirv_cross::Instruction>).buffer_size;
        local_28 = local_28 + 1) {
      pIVar3 = (this->super_VectorView<spirv_cross::Instruction>).ptr + local_28;
      pIVar4 = (other->super_VectorView<spirv_cross::Instruction>).ptr + local_28;
      uVar1 = pIVar4->count;
      uVar2 = pIVar4->offset;
      pIVar3->op = pIVar4->op;
      pIVar3->count = uVar1;
      pIVar3->offset = uVar2;
      pIVar3->length = pIVar4->length;
    }
    (this->super_VectorView<spirv_cross::Instruction>).buffer_size =
         (other->super_VectorView<spirv_cross::Instruction>).buffer_size;
  }
  return this;
}

Assistant:

SmallVector &operator=(const SmallVector &other) SPIRV_CROSS_NOEXCEPT
	{
		if (this == &other)
			return *this;

		clear();
		reserve(other.buffer_size);
		for (size_t i = 0; i < other.buffer_size; i++)
			new (&this->ptr[i]) T(other.ptr[i]);
		this->buffer_size = other.buffer_size;
		return *this;
	}